

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudio_CreateSubmixVoice
                   (FAudio *audio,FAudioSubmixVoice **ppSubmixVoice,uint32_t InputChannels,
                   uint32_t InputSampleRate,uint32_t Flags,uint32_t ProcessingStage,
                   FAudioVoiceSends *pSendList,FAudioEffectChain *pEffectChain)

{
  long lVar1;
  FAudioMutex pvVar2;
  undefined8 uVar3;
  uint in_ECX;
  uint in_EDX;
  FAudioVoiceSends *in_RSI;
  FAudioVoice *in_RDI;
  uint in_R8D;
  undefined4 in_R9D;
  double dVar4;
  uint32_t i;
  FAudioVoiceSends *unaff_retaddr;
  FAudioEffectChain *in_stack_00000090;
  FAudioVoice *in_stack_00000098;
  uint local_24;
  
  lVar1 = (**(code **)&in_RDI->outputChannels)(0x148);
  *(long *)in_RSI = lVar1;
  SDL_memset(*(long *)in_RSI,0,0x148);
  **(long **)in_RSI = (long)in_RDI;
  *(undefined4 *)(*(long *)in_RSI + 0xc) = 1;
  *(uint *)(*(long *)in_RSI + 8) = in_R8D;
  *(undefined4 *)(*(long *)in_RSI + 0x78) = 0;
  *(undefined4 *)(*(long *)in_RSI + 0x7c) = 0x3f800000;
  *(undefined4 *)(*(long *)in_RSI + 0x80) = 0x3f800000;
  pvVar2 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*(long *)in_RSI + 0x90) = pvVar2;
  pvVar2 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*(long *)in_RSI + 0x98) = pvVar2;
  pvVar2 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*(long *)in_RSI + 0xa0) = pvVar2;
  pvVar2 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*(long *)in_RSI + 0xc0) = pvVar2;
  *(uint *)(*(long *)in_RSI + 0xe8) = in_EDX;
  *(uint *)(*(long *)in_RSI + 0xec) = in_ECX;
  *(undefined4 *)(*(long *)in_RSI + 0xf0) = in_R9D;
  if (in_EDX == 1) {
    *(FAudioResampleCallback *)(*(long *)in_RSI + 0xe0) = FAudio_INTERNAL_ResampleMono;
  }
  else if (in_EDX == 2) {
    *(FAudioResampleCallback *)(*(long *)in_RSI + 0xe0) = FAudio_INTERNAL_ResampleStereo;
  }
  else {
    *(code **)(*(long *)in_RSI + 0xe0) = FAudio_INTERNAL_ResampleGeneric;
  }
  dVar4 = (double)SDL_ceil(((double)in_RDI->type * (double)in_ECX) /
                           (double)*(uint *)(*(long *)&in_RDI->sends + 0xdc));
  *(uint *)(*(long *)in_RSI + 200) = ((int)(long)dVar4 + 2) * in_EDX;
  uVar3 = (**(code **)&in_RDI->outputChannels)((ulong)*(uint *)(*(long *)in_RSI + 200) << 2);
  *(undefined8 *)(*(long *)in_RSI + 0xd0) = uVar3;
  SDL_memset(*(undefined8 *)(*(long *)in_RSI + 0xd0),0,(ulong)*(uint *)(*(long *)in_RSI + 200) << 2)
  ;
  FAudio_INTERNAL_VoiceOutputFrequency(in_RDI,in_RSI);
  FAudioVoice_SetEffectChain(in_stack_00000098,in_stack_00000090);
  *(undefined4 *)(*(long *)in_RSI + 0xa8) = 0x3f800000;
  uVar3 = (**(code **)&in_RDI->outputChannels)((ulong)*(uint *)(*(long *)in_RSI + 0xb8) << 2);
  *(undefined8 *)(*(long *)in_RSI + 0xb0) = uVar3;
  for (local_24 = 0; local_24 < *(uint *)(*(long *)in_RSI + 0xb8); local_24 = local_24 + 1) {
    *(undefined4 *)(*(long *)(*(long *)in_RSI + 0xb0) + (ulong)local_24 * 4) = 0x3f800000;
  }
  FAudioVoice_SetOutputVoices((FAudioVoice *)CONCAT44(Flags,ProcessingStage),unaff_retaddr);
  if ((in_R8D & 8) != 0) {
    uVar3 = (**(code **)&in_RDI->outputChannels)((ulong)in_EDX << 4);
    *(undefined8 *)(*(long *)in_RSI + 0x88) = uVar3;
    SDL_memset(*(undefined8 *)(*(long *)in_RSI + 0x88),0,(ulong)in_EDX << 4);
  }
  FAudio_INTERNAL_InsertSubmixSorted
            ((LinkedList **)unaff_retaddr,in_RDI,in_RSI,(FAudioMallocFunc)CONCAT44(in_EDX,in_ECX));
  FAudio_AddRef((FAudio *)in_RDI);
  return 0;
}

Assistant:

uint32_t FAudio_CreateSubmixVoice(
	FAudio *audio,
	FAudioSubmixVoice **ppSubmixVoice,
	uint32_t InputChannels,
	uint32_t InputSampleRate,
	uint32_t Flags,
	uint32_t ProcessingStage,
	const FAudioVoiceSends *pSendList,
	const FAudioEffectChain *pEffectChain
) {
	uint32_t i;

	LOG_API_ENTER(audio)

	*ppSubmixVoice = (FAudioSubmixVoice*) audio->pMalloc(sizeof(FAudioVoice));
	FAudio_zero(*ppSubmixVoice, sizeof(FAudioSubmixVoice));
	(*ppSubmixVoice)->audio = audio;
	(*ppSubmixVoice)->type = FAUDIO_VOICE_SUBMIX;
	(*ppSubmixVoice)->flags = Flags;
	(*ppSubmixVoice)->filter.Type = FAUDIO_DEFAULT_FILTER_TYPE;
	(*ppSubmixVoice)->filter.Frequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
	(*ppSubmixVoice)->filter.OneOverQ = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
	(*ppSubmixVoice)->sendLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSubmixVoice)->sendLock)
	(*ppSubmixVoice)->effectLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSubmixVoice)->effectLock)
	(*ppSubmixVoice)->filterLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSubmixVoice)->filterLock)
	(*ppSubmixVoice)->volumeLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSubmixVoice)->volumeLock)

	/* Submix Properties */
	(*ppSubmixVoice)->mix.inputChannels = InputChannels;
	(*ppSubmixVoice)->mix.inputSampleRate = InputSampleRate;
	(*ppSubmixVoice)->mix.processingStage = ProcessingStage;

	/* Resampler */
	if (InputChannels == 1)
	{
		(*ppSubmixVoice)->mix.resample = FAudio_INTERNAL_ResampleMono;
	}
	else if (InputChannels == 2)
	{
		(*ppSubmixVoice)->mix.resample = FAudio_INTERNAL_ResampleStereo;
	}
	else
	{
		(*ppSubmixVoice)->mix.resample = FAudio_INTERNAL_ResampleGeneric;
	}

	/* Sample Storage */
	(*ppSubmixVoice)->mix.inputSamples = ((uint32_t) FAudio_ceil(
		audio->updateSize *
		(double) InputSampleRate /
		(double) audio->master->master.inputSampleRate
	) + EXTRA_DECODE_PADDING) * InputChannels;
	(*ppSubmixVoice)->mix.inputCache = (float*) audio->pMalloc(
		sizeof(float) * (*ppSubmixVoice)->mix.inputSamples
	);
	FAudio_zero( /* Zero this now, for the first update */
		(*ppSubmixVoice)->mix.inputCache,
		sizeof(float) * (*ppSubmixVoice)->mix.inputSamples
	);

	/* Sends/Effects */
	FAudio_INTERNAL_VoiceOutputFrequency(*ppSubmixVoice, pSendList);
	FAudioVoice_SetEffectChain(*ppSubmixVoice, pEffectChain);

	/* Default Levels */
	(*ppSubmixVoice)->volume = 1.0f;
	(*ppSubmixVoice)->channelVolume = (float*) audio->pMalloc(
		sizeof(float) * (*ppSubmixVoice)->outputChannels
	);
	for (i = 0; i < (*ppSubmixVoice)->outputChannels; i += 1)
	{
		(*ppSubmixVoice)->channelVolume[i] = 1.0f;
	}

	FAudioVoice_SetOutputVoices(*ppSubmixVoice, pSendList);

	/* Filters */
	if (Flags & FAUDIO_VOICE_USEFILTER)
	{
		(*ppSubmixVoice)->filterState = (FAudioFilterState*) audio->pMalloc(
			sizeof(FAudioFilterState) * InputChannels
		);
		FAudio_zero(
			(*ppSubmixVoice)->filterState,
			sizeof(FAudioFilterState) * InputChannels
		);
	}

	/* Add to list, finally. */
	FAudio_INTERNAL_InsertSubmixSorted(
		&audio->submixes,
		*ppSubmixVoice,
		audio->submixLock,
		audio->pMalloc
	);
	FAudio_AddRef(audio);

	LOG_API_EXIT(audio)
	return 0;
}